

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall hwnet::ThreadPool::~ThreadPool(ThreadPool *this)

{
  size_type sVar1;
  ulong local_18;
  size_t i;
  ThreadPool *this_local;
  
  TaskQueue::Close(&this->queue_);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
    if (sVar1 <= local_18) break;
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&this->threads_,local_18);
    std::thread::join();
    local_18 = local_18 + 1;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  TaskQueue::~TaskQueue(&this->queue_);
  return;
}

Assistant:

ThreadPool::~ThreadPool() {
	queue_.Close();
	size_t i = 0;
	for( ; i < threads_.size(); ++i) {
		threads_[i].join();
	}	
}